

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::~SRGBTestCase(SRGBTestCase *this)

{
  SRGBTestCase *this_local;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SRGBTestCase_032c1c30;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[3])();
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
  ::~vector(&this->m_shaderProgramList);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters>_>
  ::~vector(&this->m_shaderParametersList);
  std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::~vector
            (&this->m_textureResultList);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->m_renderBufferList);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
  ::~vector(&this->m_samplerList);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
  ::~vector(&this->m_textureSourceList);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::~MovePtr(&this->m_framebuffer);
  gles31::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

SRGBTestCase::~SRGBTestCase (void)
{
	deinit();
}